

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

KeyFormatData * __thiscall
cfd::core::KeyFormatData::operator=(KeyFormatData *this,KeyFormatData *object)

{
  KeyFormatData *object_local;
  KeyFormatData *this_local;
  
  if (this != object) {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&this->map_,&object->map_);
    this->is_mainnet = (bool)(object->is_mainnet & 1);
    this->wif_prefix_ = object->wif_prefix_;
    ::std::vector<bool,_std::allocator<bool>_>::operator=(&this->has_format_,&object->has_format_);
    this->bip32_ = object->bip32_;
    this->bip49_ = object->bip49_;
    this->bip84_ = object->bip84_;
  }
  return this;
}

Assistant:

KeyFormatData &KeyFormatData::operator=(const KeyFormatData &object) {
  if (this != &object) {
    map_ = object.map_;
    is_mainnet = object.is_mainnet;
    wif_prefix_ = object.wif_prefix_;
    has_format_ = object.has_format_;
    bip32_ = object.bip32_;
    bip49_ = object.bip49_;
    bip84_ = object.bip84_;
  }
  return *this;
}